

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512_gemm.h
# Opt level: O1

void __thiscall
intgemm::AVX512BW::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndWrite>
          (Kernels8 *this,int8_t *A,int8_t *B,Index A_rows,Index width,Index B_cols,
          UnquantizeAndWrite callback)

{
  float *pfVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  char cVar12;
  long lVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [64];
  undefined4 in_register_0000008c;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  float in_XMM0_Da;
  undefined1 in_ZMM1 [64];
  undefined1 auVar47 [64];
  ulong local_60;
  
  if (width != 0) {
    local_60 = 0;
    auVar20 = vpternlogd_avx512f(in_ZMM1,in_ZMM1,in_ZMM1,0xff);
    auVar21 = vpbroadcastw_avx512bw(ZEXT216(1));
    auVar47 = ZEXT1664((undefined1  [16])0x0);
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
    uVar17 = 0;
    do {
      if ((int)B != 0) {
        lVar13 = local_60 * 0x40;
        pauVar15 = (undefined1 (*) [64])(A + (ulong)((A_rows >> 6) * (int)uVar17) * 0x40);
        uVar16 = 0;
        uVar14 = 0;
        do {
          auVar24 = vmovdqa64_avx512f(*(undefined1 (*) [64])(this + (int)uVar14 * A_rows));
          uVar11 = vpcmpgtb_avx512bw(auVar24,auVar20);
          auVar24 = vpabsb_avx512bw(auVar24);
          auVar25 = vmovdqa64_avx512f(*pauVar15);
          auVar26 = vmovdqa64_avx512f(pauVar15[1]);
          auVar27 = vmovdqa64_avx512f(pauVar15[2]);
          auVar28 = vmovdqa64_avx512f(pauVar15[3]);
          auVar29 = vpsubb_avx512bw(auVar47,auVar25);
          auVar25 = vmovdqu8_avx512bw(auVar25);
          bVar2 = (byte)uVar11;
          auVar30[0] = (bVar2 & 1) * auVar25[0] | !(bool)(bVar2 & 1) * auVar29[0];
          bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
          auVar30[1] = bVar3 * auVar25[1] | !bVar3 * auVar29[1];
          bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
          auVar30[2] = bVar3 * auVar25[2] | !bVar3 * auVar29[2];
          bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
          auVar30[3] = bVar3 * auVar25[3] | !bVar3 * auVar29[3];
          bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
          auVar30[4] = bVar3 * auVar25[4] | !bVar3 * auVar29[4];
          bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
          auVar30[5] = bVar3 * auVar25[5] | !bVar3 * auVar29[5];
          bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
          auVar30[6] = bVar3 * auVar25[6] | !bVar3 * auVar29[6];
          bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
          auVar30[7] = bVar3 * auVar25[7] | !bVar3 * auVar29[7];
          bVar4 = (byte)(uVar11 >> 8);
          auVar30[8] = (bVar4 & 1) * auVar25[8] | !(bool)(bVar4 & 1) * auVar29[8];
          bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
          auVar30[9] = bVar3 * auVar25[9] | !bVar3 * auVar29[9];
          bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
          auVar30[10] = bVar3 * auVar25[10] | !bVar3 * auVar29[10];
          bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
          auVar30[0xb] = bVar3 * auVar25[0xb] | !bVar3 * auVar29[0xb];
          bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
          auVar30[0xc] = bVar3 * auVar25[0xc] | !bVar3 * auVar29[0xc];
          bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
          auVar30[0xd] = bVar3 * auVar25[0xd] | !bVar3 * auVar29[0xd];
          bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
          auVar30[0xe] = bVar3 * auVar25[0xe] | !bVar3 * auVar29[0xe];
          bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
          auVar30[0xf] = bVar3 * auVar25[0xf] | !bVar3 * auVar29[0xf];
          bVar5 = (byte)(uVar11 >> 0x10);
          auVar30[0x10] = (bVar5 & 1) * auVar25[0x10] | !(bool)(bVar5 & 1) * auVar29[0x10];
          bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
          auVar30[0x11] = bVar3 * auVar25[0x11] | !bVar3 * auVar29[0x11];
          bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
          auVar30[0x12] = bVar3 * auVar25[0x12] | !bVar3 * auVar29[0x12];
          bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
          auVar30[0x13] = bVar3 * auVar25[0x13] | !bVar3 * auVar29[0x13];
          bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
          auVar30[0x14] = bVar3 * auVar25[0x14] | !bVar3 * auVar29[0x14];
          bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
          auVar30[0x15] = bVar3 * auVar25[0x15] | !bVar3 * auVar29[0x15];
          bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
          auVar30[0x16] = bVar3 * auVar25[0x16] | !bVar3 * auVar29[0x16];
          bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
          auVar30[0x17] = bVar3 * auVar25[0x17] | !bVar3 * auVar29[0x17];
          bVar6 = (byte)(uVar11 >> 0x18);
          auVar30[0x18] = (bVar6 & 1) * auVar25[0x18] | !(bool)(bVar6 & 1) * auVar29[0x18];
          bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
          auVar30[0x19] = bVar3 * auVar25[0x19] | !bVar3 * auVar29[0x19];
          bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
          auVar30[0x1a] = bVar3 * auVar25[0x1a] | !bVar3 * auVar29[0x1a];
          bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
          auVar30[0x1b] = bVar3 * auVar25[0x1b] | !bVar3 * auVar29[0x1b];
          bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
          auVar30[0x1c] = bVar3 * auVar25[0x1c] | !bVar3 * auVar29[0x1c];
          bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
          auVar30[0x1d] = bVar3 * auVar25[0x1d] | !bVar3 * auVar29[0x1d];
          bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
          auVar30[0x1e] = bVar3 * auVar25[0x1e] | !bVar3 * auVar29[0x1e];
          bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
          auVar30[0x1f] = bVar3 * auVar25[0x1f] | !bVar3 * auVar29[0x1f];
          bVar7 = (byte)(uVar11 >> 0x20);
          auVar30[0x20] = (bVar7 & 1) * auVar25[0x20] | !(bool)(bVar7 & 1) * auVar29[0x20];
          bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
          auVar30[0x21] = bVar3 * auVar25[0x21] | !bVar3 * auVar29[0x21];
          bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
          auVar30[0x22] = bVar3 * auVar25[0x22] | !bVar3 * auVar29[0x22];
          bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
          auVar30[0x23] = bVar3 * auVar25[0x23] | !bVar3 * auVar29[0x23];
          bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
          auVar30[0x24] = bVar3 * auVar25[0x24] | !bVar3 * auVar29[0x24];
          bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
          auVar30[0x25] = bVar3 * auVar25[0x25] | !bVar3 * auVar29[0x25];
          bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
          auVar30[0x26] = bVar3 * auVar25[0x26] | !bVar3 * auVar29[0x26];
          bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
          auVar30[0x27] = bVar3 * auVar25[0x27] | !bVar3 * auVar29[0x27];
          bVar8 = (byte)(uVar11 >> 0x28);
          auVar30[0x28] = (bVar8 & 1) * auVar25[0x28] | !(bool)(bVar8 & 1) * auVar29[0x28];
          bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
          auVar30[0x29] = bVar3 * auVar25[0x29] | !bVar3 * auVar29[0x29];
          bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
          auVar30[0x2a] = bVar3 * auVar25[0x2a] | !bVar3 * auVar29[0x2a];
          bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
          auVar30[0x2b] = bVar3 * auVar25[0x2b] | !bVar3 * auVar29[0x2b];
          bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
          auVar30[0x2c] = bVar3 * auVar25[0x2c] | !bVar3 * auVar29[0x2c];
          bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
          auVar30[0x2d] = bVar3 * auVar25[0x2d] | !bVar3 * auVar29[0x2d];
          bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
          auVar30[0x2e] = bVar3 * auVar25[0x2e] | !bVar3 * auVar29[0x2e];
          bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
          auVar30[0x2f] = bVar3 * auVar25[0x2f] | !bVar3 * auVar29[0x2f];
          bVar9 = (byte)(uVar11 >> 0x30);
          auVar30[0x30] = (bVar9 & 1) * auVar25[0x30] | !(bool)(bVar9 & 1) * auVar29[0x30];
          bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
          auVar30[0x31] = bVar3 * auVar25[0x31] | !bVar3 * auVar29[0x31];
          bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
          auVar30[0x32] = bVar3 * auVar25[0x32] | !bVar3 * auVar29[0x32];
          bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
          auVar30[0x33] = bVar3 * auVar25[0x33] | !bVar3 * auVar29[0x33];
          bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
          auVar30[0x34] = bVar3 * auVar25[0x34] | !bVar3 * auVar29[0x34];
          bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
          auVar30[0x35] = bVar3 * auVar25[0x35] | !bVar3 * auVar29[0x35];
          bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
          auVar30[0x36] = bVar3 * auVar25[0x36] | !bVar3 * auVar29[0x36];
          bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
          auVar30[0x37] = bVar3 * auVar25[0x37] | !bVar3 * auVar29[0x37];
          bVar10 = (byte)(uVar11 >> 0x38);
          auVar30[0x38] = (bVar10 & 1) * auVar25[0x38] | !(bool)(bVar10 & 1) * auVar29[0x38];
          bVar3 = (bool)(bVar10 >> 1 & 1);
          auVar30[0x39] = bVar3 * auVar25[0x39] | !bVar3 * auVar29[0x39];
          bVar3 = (bool)(bVar10 >> 2 & 1);
          auVar30[0x3a] = bVar3 * auVar25[0x3a] | !bVar3 * auVar29[0x3a];
          bVar3 = (bool)(bVar10 >> 3 & 1);
          auVar30[0x3b] = bVar3 * auVar25[0x3b] | !bVar3 * auVar29[0x3b];
          bVar3 = (bool)(bVar10 >> 4 & 1);
          auVar30[0x3c] = bVar3 * auVar25[0x3c] | !bVar3 * auVar29[0x3c];
          bVar3 = (bool)(bVar10 >> 5 & 1);
          auVar30[0x3d] = bVar3 * auVar25[0x3d] | !bVar3 * auVar29[0x3d];
          bVar3 = (bool)(bVar10 >> 6 & 1);
          auVar30[0x3e] = bVar3 * auVar25[0x3e] | !bVar3 * auVar29[0x3e];
          cVar12 = (char)bVar10 >> 7;
          auVar30[0x3f] = -cVar12 * auVar25[0x3f] | !(bool)-cVar12 * auVar29[0x3f];
          auVar25 = vpmaddubsw_avx512bw(auVar24,auVar30);
          auVar29 = vpsubb_avx512bw(auVar47,auVar26);
          auVar26 = vmovdqu8_avx512bw(auVar26);
          auVar31[0] = (bVar2 & 1) * auVar26[0] | !(bool)(bVar2 & 1) * auVar29[0];
          bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
          auVar31[1] = bVar3 * auVar26[1] | !bVar3 * auVar29[1];
          bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
          auVar31[2] = bVar3 * auVar26[2] | !bVar3 * auVar29[2];
          bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
          auVar31[3] = bVar3 * auVar26[3] | !bVar3 * auVar29[3];
          bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
          auVar31[4] = bVar3 * auVar26[4] | !bVar3 * auVar29[4];
          bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
          auVar31[5] = bVar3 * auVar26[5] | !bVar3 * auVar29[5];
          bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
          auVar31[6] = bVar3 * auVar26[6] | !bVar3 * auVar29[6];
          bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
          auVar31[7] = bVar3 * auVar26[7] | !bVar3 * auVar29[7];
          auVar31[8] = (bVar4 & 1) * auVar26[8] | !(bool)(bVar4 & 1) * auVar29[8];
          bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
          auVar31[9] = bVar3 * auVar26[9] | !bVar3 * auVar29[9];
          bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
          auVar31[10] = bVar3 * auVar26[10] | !bVar3 * auVar29[10];
          bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
          auVar31[0xb] = bVar3 * auVar26[0xb] | !bVar3 * auVar29[0xb];
          bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
          auVar31[0xc] = bVar3 * auVar26[0xc] | !bVar3 * auVar29[0xc];
          bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
          auVar31[0xd] = bVar3 * auVar26[0xd] | !bVar3 * auVar29[0xd];
          bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
          auVar31[0xe] = bVar3 * auVar26[0xe] | !bVar3 * auVar29[0xe];
          bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
          auVar31[0xf] = bVar3 * auVar26[0xf] | !bVar3 * auVar29[0xf];
          auVar31[0x10] = (bVar5 & 1) * auVar26[0x10] | !(bool)(bVar5 & 1) * auVar29[0x10];
          bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
          auVar31[0x11] = bVar3 * auVar26[0x11] | !bVar3 * auVar29[0x11];
          bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
          auVar31[0x12] = bVar3 * auVar26[0x12] | !bVar3 * auVar29[0x12];
          bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
          auVar31[0x13] = bVar3 * auVar26[0x13] | !bVar3 * auVar29[0x13];
          bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
          auVar31[0x14] = bVar3 * auVar26[0x14] | !bVar3 * auVar29[0x14];
          bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
          auVar31[0x15] = bVar3 * auVar26[0x15] | !bVar3 * auVar29[0x15];
          bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
          auVar31[0x16] = bVar3 * auVar26[0x16] | !bVar3 * auVar29[0x16];
          bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
          auVar31[0x17] = bVar3 * auVar26[0x17] | !bVar3 * auVar29[0x17];
          auVar31[0x18] = (bVar6 & 1) * auVar26[0x18] | !(bool)(bVar6 & 1) * auVar29[0x18];
          bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
          auVar31[0x19] = bVar3 * auVar26[0x19] | !bVar3 * auVar29[0x19];
          bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
          auVar31[0x1a] = bVar3 * auVar26[0x1a] | !bVar3 * auVar29[0x1a];
          bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
          auVar31[0x1b] = bVar3 * auVar26[0x1b] | !bVar3 * auVar29[0x1b];
          bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
          auVar31[0x1c] = bVar3 * auVar26[0x1c] | !bVar3 * auVar29[0x1c];
          bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
          auVar31[0x1d] = bVar3 * auVar26[0x1d] | !bVar3 * auVar29[0x1d];
          bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
          auVar31[0x1e] = bVar3 * auVar26[0x1e] | !bVar3 * auVar29[0x1e];
          bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
          auVar31[0x1f] = bVar3 * auVar26[0x1f] | !bVar3 * auVar29[0x1f];
          auVar31[0x20] = (bVar7 & 1) * auVar26[0x20] | !(bool)(bVar7 & 1) * auVar29[0x20];
          bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
          auVar31[0x21] = bVar3 * auVar26[0x21] | !bVar3 * auVar29[0x21];
          bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
          auVar31[0x22] = bVar3 * auVar26[0x22] | !bVar3 * auVar29[0x22];
          bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
          auVar31[0x23] = bVar3 * auVar26[0x23] | !bVar3 * auVar29[0x23];
          bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
          auVar31[0x24] = bVar3 * auVar26[0x24] | !bVar3 * auVar29[0x24];
          bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
          auVar31[0x25] = bVar3 * auVar26[0x25] | !bVar3 * auVar29[0x25];
          bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
          auVar31[0x26] = bVar3 * auVar26[0x26] | !bVar3 * auVar29[0x26];
          bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
          auVar31[0x27] = bVar3 * auVar26[0x27] | !bVar3 * auVar29[0x27];
          auVar31[0x28] = (bVar8 & 1) * auVar26[0x28] | !(bool)(bVar8 & 1) * auVar29[0x28];
          bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
          auVar31[0x29] = bVar3 * auVar26[0x29] | !bVar3 * auVar29[0x29];
          bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
          auVar31[0x2a] = bVar3 * auVar26[0x2a] | !bVar3 * auVar29[0x2a];
          bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
          auVar31[0x2b] = bVar3 * auVar26[0x2b] | !bVar3 * auVar29[0x2b];
          bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
          auVar31[0x2c] = bVar3 * auVar26[0x2c] | !bVar3 * auVar29[0x2c];
          bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
          auVar31[0x2d] = bVar3 * auVar26[0x2d] | !bVar3 * auVar29[0x2d];
          bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
          auVar31[0x2e] = bVar3 * auVar26[0x2e] | !bVar3 * auVar29[0x2e];
          bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
          auVar31[0x2f] = bVar3 * auVar26[0x2f] | !bVar3 * auVar29[0x2f];
          auVar31[0x30] = (bVar9 & 1) * auVar26[0x30] | !(bool)(bVar9 & 1) * auVar29[0x30];
          bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
          auVar31[0x31] = bVar3 * auVar26[0x31] | !bVar3 * auVar29[0x31];
          bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
          auVar31[0x32] = bVar3 * auVar26[0x32] | !bVar3 * auVar29[0x32];
          bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
          auVar31[0x33] = bVar3 * auVar26[0x33] | !bVar3 * auVar29[0x33];
          bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
          auVar31[0x34] = bVar3 * auVar26[0x34] | !bVar3 * auVar29[0x34];
          bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
          auVar31[0x35] = bVar3 * auVar26[0x35] | !bVar3 * auVar29[0x35];
          bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
          auVar31[0x36] = bVar3 * auVar26[0x36] | !bVar3 * auVar29[0x36];
          bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
          auVar31[0x37] = bVar3 * auVar26[0x37] | !bVar3 * auVar29[0x37];
          auVar31[0x38] = (bVar10 & 1) * auVar26[0x38] | !(bool)(bVar10 & 1) * auVar29[0x38];
          bVar3 = (bool)(bVar10 >> 1 & 1);
          auVar31[0x39] = bVar3 * auVar26[0x39] | !bVar3 * auVar29[0x39];
          bVar3 = (bool)(bVar10 >> 2 & 1);
          auVar31[0x3a] = bVar3 * auVar26[0x3a] | !bVar3 * auVar29[0x3a];
          bVar3 = (bool)(bVar10 >> 3 & 1);
          auVar31[0x3b] = bVar3 * auVar26[0x3b] | !bVar3 * auVar29[0x3b];
          bVar3 = (bool)(bVar10 >> 4 & 1);
          auVar31[0x3c] = bVar3 * auVar26[0x3c] | !bVar3 * auVar29[0x3c];
          bVar3 = (bool)(bVar10 >> 5 & 1);
          auVar31[0x3d] = bVar3 * auVar26[0x3d] | !bVar3 * auVar29[0x3d];
          bVar3 = (bool)(bVar10 >> 6 & 1);
          auVar31[0x3e] = bVar3 * auVar26[0x3e] | !bVar3 * auVar29[0x3e];
          auVar31[0x3f] = -cVar12 * auVar26[0x3f] | !(bool)-cVar12 * auVar29[0x3f];
          auVar26 = vpmaddubsw_avx512bw(auVar24,auVar31);
          auVar29 = vpsubb_avx512bw(auVar47,auVar27);
          auVar27 = vmovdqu8_avx512bw(auVar27);
          auVar32[0] = (bVar2 & 1) * auVar27[0] | !(bool)(bVar2 & 1) * auVar29[0];
          bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
          auVar32[1] = bVar3 * auVar27[1] | !bVar3 * auVar29[1];
          bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
          auVar32[2] = bVar3 * auVar27[2] | !bVar3 * auVar29[2];
          bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
          auVar32[3] = bVar3 * auVar27[3] | !bVar3 * auVar29[3];
          bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
          auVar32[4] = bVar3 * auVar27[4] | !bVar3 * auVar29[4];
          bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
          auVar32[5] = bVar3 * auVar27[5] | !bVar3 * auVar29[5];
          bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
          auVar32[6] = bVar3 * auVar27[6] | !bVar3 * auVar29[6];
          bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
          auVar32[7] = bVar3 * auVar27[7] | !bVar3 * auVar29[7];
          auVar32[8] = (bVar4 & 1) * auVar27[8] | !(bool)(bVar4 & 1) * auVar29[8];
          bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
          auVar32[9] = bVar3 * auVar27[9] | !bVar3 * auVar29[9];
          bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
          auVar32[10] = bVar3 * auVar27[10] | !bVar3 * auVar29[10];
          bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
          auVar32[0xb] = bVar3 * auVar27[0xb] | !bVar3 * auVar29[0xb];
          bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
          auVar32[0xc] = bVar3 * auVar27[0xc] | !bVar3 * auVar29[0xc];
          bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
          auVar32[0xd] = bVar3 * auVar27[0xd] | !bVar3 * auVar29[0xd];
          bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
          auVar32[0xe] = bVar3 * auVar27[0xe] | !bVar3 * auVar29[0xe];
          bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
          auVar32[0xf] = bVar3 * auVar27[0xf] | !bVar3 * auVar29[0xf];
          auVar32[0x10] = (bVar5 & 1) * auVar27[0x10] | !(bool)(bVar5 & 1) * auVar29[0x10];
          bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
          auVar32[0x11] = bVar3 * auVar27[0x11] | !bVar3 * auVar29[0x11];
          bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
          auVar32[0x12] = bVar3 * auVar27[0x12] | !bVar3 * auVar29[0x12];
          bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
          auVar32[0x13] = bVar3 * auVar27[0x13] | !bVar3 * auVar29[0x13];
          bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
          auVar32[0x14] = bVar3 * auVar27[0x14] | !bVar3 * auVar29[0x14];
          bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
          auVar32[0x15] = bVar3 * auVar27[0x15] | !bVar3 * auVar29[0x15];
          bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
          auVar32[0x16] = bVar3 * auVar27[0x16] | !bVar3 * auVar29[0x16];
          bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
          auVar32[0x17] = bVar3 * auVar27[0x17] | !bVar3 * auVar29[0x17];
          auVar32[0x18] = (bVar6 & 1) * auVar27[0x18] | !(bool)(bVar6 & 1) * auVar29[0x18];
          bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
          auVar32[0x19] = bVar3 * auVar27[0x19] | !bVar3 * auVar29[0x19];
          bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
          auVar32[0x1a] = bVar3 * auVar27[0x1a] | !bVar3 * auVar29[0x1a];
          bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
          auVar32[0x1b] = bVar3 * auVar27[0x1b] | !bVar3 * auVar29[0x1b];
          bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
          auVar32[0x1c] = bVar3 * auVar27[0x1c] | !bVar3 * auVar29[0x1c];
          bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
          auVar32[0x1d] = bVar3 * auVar27[0x1d] | !bVar3 * auVar29[0x1d];
          bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
          auVar32[0x1e] = bVar3 * auVar27[0x1e] | !bVar3 * auVar29[0x1e];
          bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
          auVar32[0x1f] = bVar3 * auVar27[0x1f] | !bVar3 * auVar29[0x1f];
          auVar32[0x20] = (bVar7 & 1) * auVar27[0x20] | !(bool)(bVar7 & 1) * auVar29[0x20];
          bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
          auVar32[0x21] = bVar3 * auVar27[0x21] | !bVar3 * auVar29[0x21];
          bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
          auVar32[0x22] = bVar3 * auVar27[0x22] | !bVar3 * auVar29[0x22];
          bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
          auVar32[0x23] = bVar3 * auVar27[0x23] | !bVar3 * auVar29[0x23];
          bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
          auVar32[0x24] = bVar3 * auVar27[0x24] | !bVar3 * auVar29[0x24];
          bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
          auVar32[0x25] = bVar3 * auVar27[0x25] | !bVar3 * auVar29[0x25];
          bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
          auVar32[0x26] = bVar3 * auVar27[0x26] | !bVar3 * auVar29[0x26];
          bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
          auVar32[0x27] = bVar3 * auVar27[0x27] | !bVar3 * auVar29[0x27];
          auVar32[0x28] = (bVar8 & 1) * auVar27[0x28] | !(bool)(bVar8 & 1) * auVar29[0x28];
          bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
          auVar32[0x29] = bVar3 * auVar27[0x29] | !bVar3 * auVar29[0x29];
          bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
          auVar32[0x2a] = bVar3 * auVar27[0x2a] | !bVar3 * auVar29[0x2a];
          bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
          auVar32[0x2b] = bVar3 * auVar27[0x2b] | !bVar3 * auVar29[0x2b];
          bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
          auVar32[0x2c] = bVar3 * auVar27[0x2c] | !bVar3 * auVar29[0x2c];
          bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
          auVar32[0x2d] = bVar3 * auVar27[0x2d] | !bVar3 * auVar29[0x2d];
          bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
          auVar32[0x2e] = bVar3 * auVar27[0x2e] | !bVar3 * auVar29[0x2e];
          bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
          auVar32[0x2f] = bVar3 * auVar27[0x2f] | !bVar3 * auVar29[0x2f];
          auVar32[0x30] = (bVar9 & 1) * auVar27[0x30] | !(bool)(bVar9 & 1) * auVar29[0x30];
          bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
          auVar32[0x31] = bVar3 * auVar27[0x31] | !bVar3 * auVar29[0x31];
          bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
          auVar32[0x32] = bVar3 * auVar27[0x32] | !bVar3 * auVar29[0x32];
          bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
          auVar32[0x33] = bVar3 * auVar27[0x33] | !bVar3 * auVar29[0x33];
          bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
          auVar32[0x34] = bVar3 * auVar27[0x34] | !bVar3 * auVar29[0x34];
          bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
          auVar32[0x35] = bVar3 * auVar27[0x35] | !bVar3 * auVar29[0x35];
          bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
          auVar32[0x36] = bVar3 * auVar27[0x36] | !bVar3 * auVar29[0x36];
          bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
          auVar32[0x37] = bVar3 * auVar27[0x37] | !bVar3 * auVar29[0x37];
          auVar32[0x38] = (bVar10 & 1) * auVar27[0x38] | !(bool)(bVar10 & 1) * auVar29[0x38];
          bVar3 = (bool)(bVar10 >> 1 & 1);
          auVar32[0x39] = bVar3 * auVar27[0x39] | !bVar3 * auVar29[0x39];
          bVar3 = (bool)(bVar10 >> 2 & 1);
          auVar32[0x3a] = bVar3 * auVar27[0x3a] | !bVar3 * auVar29[0x3a];
          bVar3 = (bool)(bVar10 >> 3 & 1);
          auVar32[0x3b] = bVar3 * auVar27[0x3b] | !bVar3 * auVar29[0x3b];
          bVar3 = (bool)(bVar10 >> 4 & 1);
          auVar32[0x3c] = bVar3 * auVar27[0x3c] | !bVar3 * auVar29[0x3c];
          bVar3 = (bool)(bVar10 >> 5 & 1);
          auVar32[0x3d] = bVar3 * auVar27[0x3d] | !bVar3 * auVar29[0x3d];
          bVar3 = (bool)(bVar10 >> 6 & 1);
          auVar32[0x3e] = bVar3 * auVar27[0x3e] | !bVar3 * auVar29[0x3e];
          auVar32[0x3f] = -cVar12 * auVar27[0x3f] | !(bool)-cVar12 * auVar29[0x3f];
          auVar27 = vpmaddubsw_avx512bw(auVar24,auVar32);
          auVar29 = vpsubb_avx512bw(auVar47,auVar28);
          auVar28 = vmovdqu8_avx512bw(auVar28);
          auVar33[0] = (bVar2 & 1) * auVar28[0] | !(bool)(bVar2 & 1) * auVar29[0];
          bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
          auVar33[1] = bVar3 * auVar28[1] | !bVar3 * auVar29[1];
          bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
          auVar33[2] = bVar3 * auVar28[2] | !bVar3 * auVar29[2];
          bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
          auVar33[3] = bVar3 * auVar28[3] | !bVar3 * auVar29[3];
          bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
          auVar33[4] = bVar3 * auVar28[4] | !bVar3 * auVar29[4];
          bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
          auVar33[5] = bVar3 * auVar28[5] | !bVar3 * auVar29[5];
          bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
          auVar33[6] = bVar3 * auVar28[6] | !bVar3 * auVar29[6];
          bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
          auVar33[7] = bVar3 * auVar28[7] | !bVar3 * auVar29[7];
          auVar33[8] = (bVar4 & 1) * auVar28[8] | !(bool)(bVar4 & 1) * auVar29[8];
          bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
          auVar33[9] = bVar3 * auVar28[9] | !bVar3 * auVar29[9];
          bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
          auVar33[10] = bVar3 * auVar28[10] | !bVar3 * auVar29[10];
          bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
          auVar33[0xb] = bVar3 * auVar28[0xb] | !bVar3 * auVar29[0xb];
          bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
          auVar33[0xc] = bVar3 * auVar28[0xc] | !bVar3 * auVar29[0xc];
          bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
          auVar33[0xd] = bVar3 * auVar28[0xd] | !bVar3 * auVar29[0xd];
          bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
          auVar33[0xe] = bVar3 * auVar28[0xe] | !bVar3 * auVar29[0xe];
          bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
          auVar33[0xf] = bVar3 * auVar28[0xf] | !bVar3 * auVar29[0xf];
          auVar33[0x10] = (bVar5 & 1) * auVar28[0x10] | !(bool)(bVar5 & 1) * auVar29[0x10];
          bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
          auVar33[0x11] = bVar3 * auVar28[0x11] | !bVar3 * auVar29[0x11];
          bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
          auVar33[0x12] = bVar3 * auVar28[0x12] | !bVar3 * auVar29[0x12];
          bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
          auVar33[0x13] = bVar3 * auVar28[0x13] | !bVar3 * auVar29[0x13];
          bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
          auVar33[0x14] = bVar3 * auVar28[0x14] | !bVar3 * auVar29[0x14];
          bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
          auVar33[0x15] = bVar3 * auVar28[0x15] | !bVar3 * auVar29[0x15];
          bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
          auVar33[0x16] = bVar3 * auVar28[0x16] | !bVar3 * auVar29[0x16];
          bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
          auVar33[0x17] = bVar3 * auVar28[0x17] | !bVar3 * auVar29[0x17];
          auVar33[0x18] = (bVar6 & 1) * auVar28[0x18] | !(bool)(bVar6 & 1) * auVar29[0x18];
          bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
          auVar33[0x19] = bVar3 * auVar28[0x19] | !bVar3 * auVar29[0x19];
          bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
          auVar33[0x1a] = bVar3 * auVar28[0x1a] | !bVar3 * auVar29[0x1a];
          bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
          auVar33[0x1b] = bVar3 * auVar28[0x1b] | !bVar3 * auVar29[0x1b];
          bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
          auVar33[0x1c] = bVar3 * auVar28[0x1c] | !bVar3 * auVar29[0x1c];
          bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
          auVar33[0x1d] = bVar3 * auVar28[0x1d] | !bVar3 * auVar29[0x1d];
          bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
          auVar33[0x1e] = bVar3 * auVar28[0x1e] | !bVar3 * auVar29[0x1e];
          bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
          auVar33[0x1f] = bVar3 * auVar28[0x1f] | !bVar3 * auVar29[0x1f];
          auVar33[0x20] = (bVar7 & 1) * auVar28[0x20] | !(bool)(bVar7 & 1) * auVar29[0x20];
          bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
          auVar33[0x21] = bVar3 * auVar28[0x21] | !bVar3 * auVar29[0x21];
          bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
          auVar33[0x22] = bVar3 * auVar28[0x22] | !bVar3 * auVar29[0x22];
          bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
          auVar33[0x23] = bVar3 * auVar28[0x23] | !bVar3 * auVar29[0x23];
          bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
          auVar33[0x24] = bVar3 * auVar28[0x24] | !bVar3 * auVar29[0x24];
          bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
          auVar33[0x25] = bVar3 * auVar28[0x25] | !bVar3 * auVar29[0x25];
          bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
          auVar33[0x26] = bVar3 * auVar28[0x26] | !bVar3 * auVar29[0x26];
          bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
          auVar33[0x27] = bVar3 * auVar28[0x27] | !bVar3 * auVar29[0x27];
          auVar33[0x28] = (bVar8 & 1) * auVar28[0x28] | !(bool)(bVar8 & 1) * auVar29[0x28];
          bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
          auVar33[0x29] = bVar3 * auVar28[0x29] | !bVar3 * auVar29[0x29];
          bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
          auVar33[0x2a] = bVar3 * auVar28[0x2a] | !bVar3 * auVar29[0x2a];
          bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
          auVar33[0x2b] = bVar3 * auVar28[0x2b] | !bVar3 * auVar29[0x2b];
          bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
          auVar33[0x2c] = bVar3 * auVar28[0x2c] | !bVar3 * auVar29[0x2c];
          bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
          auVar33[0x2d] = bVar3 * auVar28[0x2d] | !bVar3 * auVar29[0x2d];
          bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
          auVar33[0x2e] = bVar3 * auVar28[0x2e] | !bVar3 * auVar29[0x2e];
          bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
          auVar33[0x2f] = bVar3 * auVar28[0x2f] | !bVar3 * auVar29[0x2f];
          auVar33[0x30] = (bVar9 & 1) * auVar28[0x30] | !(bool)(bVar9 & 1) * auVar29[0x30];
          bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
          auVar33[0x31] = bVar3 * auVar28[0x31] | !bVar3 * auVar29[0x31];
          bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
          auVar33[0x32] = bVar3 * auVar28[0x32] | !bVar3 * auVar29[0x32];
          bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
          auVar33[0x33] = bVar3 * auVar28[0x33] | !bVar3 * auVar29[0x33];
          bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
          auVar33[0x34] = bVar3 * auVar28[0x34] | !bVar3 * auVar29[0x34];
          bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
          auVar33[0x35] = bVar3 * auVar28[0x35] | !bVar3 * auVar29[0x35];
          bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
          auVar33[0x36] = bVar3 * auVar28[0x36] | !bVar3 * auVar29[0x36];
          bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
          auVar33[0x37] = bVar3 * auVar28[0x37] | !bVar3 * auVar29[0x37];
          auVar33[0x38] = (bVar10 & 1) * auVar28[0x38] | !(bool)(bVar10 & 1) * auVar29[0x38];
          bVar3 = (bool)(bVar10 >> 1 & 1);
          auVar33[0x39] = bVar3 * auVar28[0x39] | !bVar3 * auVar29[0x39];
          bVar3 = (bool)(bVar10 >> 2 & 1);
          auVar33[0x3a] = bVar3 * auVar28[0x3a] | !bVar3 * auVar29[0x3a];
          bVar3 = (bool)(bVar10 >> 3 & 1);
          auVar33[0x3b] = bVar3 * auVar28[0x3b] | !bVar3 * auVar29[0x3b];
          bVar3 = (bool)(bVar10 >> 4 & 1);
          auVar33[0x3c] = bVar3 * auVar28[0x3c] | !bVar3 * auVar29[0x3c];
          bVar3 = (bool)(bVar10 >> 5 & 1);
          auVar33[0x3d] = bVar3 * auVar28[0x3d] | !bVar3 * auVar29[0x3d];
          bVar3 = (bool)(bVar10 >> 6 & 1);
          auVar33[0x3e] = bVar3 * auVar28[0x3e] | !bVar3 * auVar29[0x3e];
          auVar33[0x3f] = -cVar12 * auVar28[0x3f] | !(bool)-cVar12 * auVar29[0x3f];
          auVar28 = vpmaddubsw_avx512bw(auVar24,auVar33);
          auVar29 = vmovdqa64_avx512f(pauVar15[4]);
          auVar30 = vpsubb_avx512bw(auVar47,auVar29);
          auVar29 = vmovdqu8_avx512bw(auVar29);
          auVar34[0] = (bVar2 & 1) * auVar29[0] | !(bool)(bVar2 & 1) * auVar30[0];
          bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
          auVar34[1] = bVar3 * auVar29[1] | !bVar3 * auVar30[1];
          bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
          auVar34[2] = bVar3 * auVar29[2] | !bVar3 * auVar30[2];
          bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
          auVar34[3] = bVar3 * auVar29[3] | !bVar3 * auVar30[3];
          bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
          auVar34[4] = bVar3 * auVar29[4] | !bVar3 * auVar30[4];
          bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
          auVar34[5] = bVar3 * auVar29[5] | !bVar3 * auVar30[5];
          bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
          auVar34[6] = bVar3 * auVar29[6] | !bVar3 * auVar30[6];
          bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
          auVar34[7] = bVar3 * auVar29[7] | !bVar3 * auVar30[7];
          auVar34[8] = (bVar4 & 1) * auVar29[8] | !(bool)(bVar4 & 1) * auVar30[8];
          bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
          auVar34[9] = bVar3 * auVar29[9] | !bVar3 * auVar30[9];
          bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
          auVar34[10] = bVar3 * auVar29[10] | !bVar3 * auVar30[10];
          bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
          auVar34[0xb] = bVar3 * auVar29[0xb] | !bVar3 * auVar30[0xb];
          bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
          auVar34[0xc] = bVar3 * auVar29[0xc] | !bVar3 * auVar30[0xc];
          bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
          auVar34[0xd] = bVar3 * auVar29[0xd] | !bVar3 * auVar30[0xd];
          bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
          auVar34[0xe] = bVar3 * auVar29[0xe] | !bVar3 * auVar30[0xe];
          bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
          auVar34[0xf] = bVar3 * auVar29[0xf] | !bVar3 * auVar30[0xf];
          auVar34[0x10] = (bVar5 & 1) * auVar29[0x10] | !(bool)(bVar5 & 1) * auVar30[0x10];
          bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
          auVar34[0x11] = bVar3 * auVar29[0x11] | !bVar3 * auVar30[0x11];
          bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
          auVar34[0x12] = bVar3 * auVar29[0x12] | !bVar3 * auVar30[0x12];
          bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
          auVar34[0x13] = bVar3 * auVar29[0x13] | !bVar3 * auVar30[0x13];
          bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
          auVar34[0x14] = bVar3 * auVar29[0x14] | !bVar3 * auVar30[0x14];
          bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
          auVar34[0x15] = bVar3 * auVar29[0x15] | !bVar3 * auVar30[0x15];
          bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
          auVar34[0x16] = bVar3 * auVar29[0x16] | !bVar3 * auVar30[0x16];
          bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
          auVar34[0x17] = bVar3 * auVar29[0x17] | !bVar3 * auVar30[0x17];
          auVar34[0x18] = (bVar6 & 1) * auVar29[0x18] | !(bool)(bVar6 & 1) * auVar30[0x18];
          bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
          auVar34[0x19] = bVar3 * auVar29[0x19] | !bVar3 * auVar30[0x19];
          bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
          auVar34[0x1a] = bVar3 * auVar29[0x1a] | !bVar3 * auVar30[0x1a];
          bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
          auVar34[0x1b] = bVar3 * auVar29[0x1b] | !bVar3 * auVar30[0x1b];
          bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
          auVar34[0x1c] = bVar3 * auVar29[0x1c] | !bVar3 * auVar30[0x1c];
          bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
          auVar34[0x1d] = bVar3 * auVar29[0x1d] | !bVar3 * auVar30[0x1d];
          bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
          auVar34[0x1e] = bVar3 * auVar29[0x1e] | !bVar3 * auVar30[0x1e];
          bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
          auVar34[0x1f] = bVar3 * auVar29[0x1f] | !bVar3 * auVar30[0x1f];
          auVar34[0x20] = (bVar7 & 1) * auVar29[0x20] | !(bool)(bVar7 & 1) * auVar30[0x20];
          bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
          auVar34[0x21] = bVar3 * auVar29[0x21] | !bVar3 * auVar30[0x21];
          bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
          auVar34[0x22] = bVar3 * auVar29[0x22] | !bVar3 * auVar30[0x22];
          bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
          auVar34[0x23] = bVar3 * auVar29[0x23] | !bVar3 * auVar30[0x23];
          bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
          auVar34[0x24] = bVar3 * auVar29[0x24] | !bVar3 * auVar30[0x24];
          bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
          auVar34[0x25] = bVar3 * auVar29[0x25] | !bVar3 * auVar30[0x25];
          bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
          auVar34[0x26] = bVar3 * auVar29[0x26] | !bVar3 * auVar30[0x26];
          bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
          auVar34[0x27] = bVar3 * auVar29[0x27] | !bVar3 * auVar30[0x27];
          auVar34[0x28] = (bVar8 & 1) * auVar29[0x28] | !(bool)(bVar8 & 1) * auVar30[0x28];
          bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
          auVar34[0x29] = bVar3 * auVar29[0x29] | !bVar3 * auVar30[0x29];
          bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
          auVar34[0x2a] = bVar3 * auVar29[0x2a] | !bVar3 * auVar30[0x2a];
          bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
          auVar34[0x2b] = bVar3 * auVar29[0x2b] | !bVar3 * auVar30[0x2b];
          bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
          auVar34[0x2c] = bVar3 * auVar29[0x2c] | !bVar3 * auVar30[0x2c];
          bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
          auVar34[0x2d] = bVar3 * auVar29[0x2d] | !bVar3 * auVar30[0x2d];
          bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
          auVar34[0x2e] = bVar3 * auVar29[0x2e] | !bVar3 * auVar30[0x2e];
          bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
          auVar34[0x2f] = bVar3 * auVar29[0x2f] | !bVar3 * auVar30[0x2f];
          auVar34[0x30] = (bVar9 & 1) * auVar29[0x30] | !(bool)(bVar9 & 1) * auVar30[0x30];
          bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
          auVar34[0x31] = bVar3 * auVar29[0x31] | !bVar3 * auVar30[0x31];
          bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
          auVar34[0x32] = bVar3 * auVar29[0x32] | !bVar3 * auVar30[0x32];
          bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
          auVar34[0x33] = bVar3 * auVar29[0x33] | !bVar3 * auVar30[0x33];
          bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
          auVar34[0x34] = bVar3 * auVar29[0x34] | !bVar3 * auVar30[0x34];
          bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
          auVar34[0x35] = bVar3 * auVar29[0x35] | !bVar3 * auVar30[0x35];
          bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
          auVar34[0x36] = bVar3 * auVar29[0x36] | !bVar3 * auVar30[0x36];
          bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
          auVar34[0x37] = bVar3 * auVar29[0x37] | !bVar3 * auVar30[0x37];
          auVar34[0x38] = (bVar10 & 1) * auVar29[0x38] | !(bool)(bVar10 & 1) * auVar30[0x38];
          bVar3 = (bool)(bVar10 >> 1 & 1);
          auVar34[0x39] = bVar3 * auVar29[0x39] | !bVar3 * auVar30[0x39];
          bVar3 = (bool)(bVar10 >> 2 & 1);
          auVar34[0x3a] = bVar3 * auVar29[0x3a] | !bVar3 * auVar30[0x3a];
          bVar3 = (bool)(bVar10 >> 3 & 1);
          auVar34[0x3b] = bVar3 * auVar29[0x3b] | !bVar3 * auVar30[0x3b];
          bVar3 = (bool)(bVar10 >> 4 & 1);
          auVar34[0x3c] = bVar3 * auVar29[0x3c] | !bVar3 * auVar30[0x3c];
          bVar3 = (bool)(bVar10 >> 5 & 1);
          auVar34[0x3d] = bVar3 * auVar29[0x3d] | !bVar3 * auVar30[0x3d];
          bVar3 = (bool)(bVar10 >> 6 & 1);
          auVar34[0x3e] = bVar3 * auVar29[0x3e] | !bVar3 * auVar30[0x3e];
          auVar34[0x3f] = -cVar12 * auVar29[0x3f] | !(bool)-cVar12 * auVar30[0x3f];
          auVar29 = vpmaddubsw_avx512bw(auVar24,auVar34);
          auVar30 = vmovdqa64_avx512f(pauVar15[5]);
          auVar31 = vpsubb_avx512bw(auVar47,auVar30);
          auVar30 = vmovdqu8_avx512bw(auVar30);
          auVar35[0] = (bVar2 & 1) * auVar30[0] | !(bool)(bVar2 & 1) * auVar31[0];
          bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
          auVar35[1] = bVar3 * auVar30[1] | !bVar3 * auVar31[1];
          bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
          auVar35[2] = bVar3 * auVar30[2] | !bVar3 * auVar31[2];
          bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
          auVar35[3] = bVar3 * auVar30[3] | !bVar3 * auVar31[3];
          bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
          auVar35[4] = bVar3 * auVar30[4] | !bVar3 * auVar31[4];
          bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
          auVar35[5] = bVar3 * auVar30[5] | !bVar3 * auVar31[5];
          bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
          auVar35[6] = bVar3 * auVar30[6] | !bVar3 * auVar31[6];
          bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
          auVar35[7] = bVar3 * auVar30[7] | !bVar3 * auVar31[7];
          auVar35[8] = (bVar4 & 1) * auVar30[8] | !(bool)(bVar4 & 1) * auVar31[8];
          bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
          auVar35[9] = bVar3 * auVar30[9] | !bVar3 * auVar31[9];
          bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
          auVar35[10] = bVar3 * auVar30[10] | !bVar3 * auVar31[10];
          bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
          auVar35[0xb] = bVar3 * auVar30[0xb] | !bVar3 * auVar31[0xb];
          bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
          auVar35[0xc] = bVar3 * auVar30[0xc] | !bVar3 * auVar31[0xc];
          bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
          auVar35[0xd] = bVar3 * auVar30[0xd] | !bVar3 * auVar31[0xd];
          bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
          auVar35[0xe] = bVar3 * auVar30[0xe] | !bVar3 * auVar31[0xe];
          bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
          auVar35[0xf] = bVar3 * auVar30[0xf] | !bVar3 * auVar31[0xf];
          auVar35[0x10] = (bVar5 & 1) * auVar30[0x10] | !(bool)(bVar5 & 1) * auVar31[0x10];
          bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
          auVar35[0x11] = bVar3 * auVar30[0x11] | !bVar3 * auVar31[0x11];
          bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
          auVar35[0x12] = bVar3 * auVar30[0x12] | !bVar3 * auVar31[0x12];
          bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
          auVar35[0x13] = bVar3 * auVar30[0x13] | !bVar3 * auVar31[0x13];
          bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
          auVar35[0x14] = bVar3 * auVar30[0x14] | !bVar3 * auVar31[0x14];
          bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
          auVar35[0x15] = bVar3 * auVar30[0x15] | !bVar3 * auVar31[0x15];
          bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
          auVar35[0x16] = bVar3 * auVar30[0x16] | !bVar3 * auVar31[0x16];
          bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
          auVar35[0x17] = bVar3 * auVar30[0x17] | !bVar3 * auVar31[0x17];
          auVar35[0x18] = (bVar6 & 1) * auVar30[0x18] | !(bool)(bVar6 & 1) * auVar31[0x18];
          bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
          auVar35[0x19] = bVar3 * auVar30[0x19] | !bVar3 * auVar31[0x19];
          bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
          auVar35[0x1a] = bVar3 * auVar30[0x1a] | !bVar3 * auVar31[0x1a];
          bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
          auVar35[0x1b] = bVar3 * auVar30[0x1b] | !bVar3 * auVar31[0x1b];
          bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
          auVar35[0x1c] = bVar3 * auVar30[0x1c] | !bVar3 * auVar31[0x1c];
          bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
          auVar35[0x1d] = bVar3 * auVar30[0x1d] | !bVar3 * auVar31[0x1d];
          bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
          auVar35[0x1e] = bVar3 * auVar30[0x1e] | !bVar3 * auVar31[0x1e];
          bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
          auVar35[0x1f] = bVar3 * auVar30[0x1f] | !bVar3 * auVar31[0x1f];
          auVar35[0x20] = (bVar7 & 1) * auVar30[0x20] | !(bool)(bVar7 & 1) * auVar31[0x20];
          bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
          auVar35[0x21] = bVar3 * auVar30[0x21] | !bVar3 * auVar31[0x21];
          bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
          auVar35[0x22] = bVar3 * auVar30[0x22] | !bVar3 * auVar31[0x22];
          bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
          auVar35[0x23] = bVar3 * auVar30[0x23] | !bVar3 * auVar31[0x23];
          bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
          auVar35[0x24] = bVar3 * auVar30[0x24] | !bVar3 * auVar31[0x24];
          bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
          auVar35[0x25] = bVar3 * auVar30[0x25] | !bVar3 * auVar31[0x25];
          bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
          auVar35[0x26] = bVar3 * auVar30[0x26] | !bVar3 * auVar31[0x26];
          bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
          auVar35[0x27] = bVar3 * auVar30[0x27] | !bVar3 * auVar31[0x27];
          auVar35[0x28] = (bVar8 & 1) * auVar30[0x28] | !(bool)(bVar8 & 1) * auVar31[0x28];
          bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
          auVar35[0x29] = bVar3 * auVar30[0x29] | !bVar3 * auVar31[0x29];
          bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
          auVar35[0x2a] = bVar3 * auVar30[0x2a] | !bVar3 * auVar31[0x2a];
          bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
          auVar35[0x2b] = bVar3 * auVar30[0x2b] | !bVar3 * auVar31[0x2b];
          bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
          auVar35[0x2c] = bVar3 * auVar30[0x2c] | !bVar3 * auVar31[0x2c];
          bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
          auVar35[0x2d] = bVar3 * auVar30[0x2d] | !bVar3 * auVar31[0x2d];
          bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
          auVar35[0x2e] = bVar3 * auVar30[0x2e] | !bVar3 * auVar31[0x2e];
          bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
          auVar35[0x2f] = bVar3 * auVar30[0x2f] | !bVar3 * auVar31[0x2f];
          auVar35[0x30] = (bVar9 & 1) * auVar30[0x30] | !(bool)(bVar9 & 1) * auVar31[0x30];
          bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
          auVar35[0x31] = bVar3 * auVar30[0x31] | !bVar3 * auVar31[0x31];
          bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
          auVar35[0x32] = bVar3 * auVar30[0x32] | !bVar3 * auVar31[0x32];
          bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
          auVar35[0x33] = bVar3 * auVar30[0x33] | !bVar3 * auVar31[0x33];
          bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
          auVar35[0x34] = bVar3 * auVar30[0x34] | !bVar3 * auVar31[0x34];
          bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
          auVar35[0x35] = bVar3 * auVar30[0x35] | !bVar3 * auVar31[0x35];
          bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
          auVar35[0x36] = bVar3 * auVar30[0x36] | !bVar3 * auVar31[0x36];
          bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
          auVar35[0x37] = bVar3 * auVar30[0x37] | !bVar3 * auVar31[0x37];
          auVar35[0x38] = (bVar10 & 1) * auVar30[0x38] | !(bool)(bVar10 & 1) * auVar31[0x38];
          bVar3 = (bool)(bVar10 >> 1 & 1);
          auVar35[0x39] = bVar3 * auVar30[0x39] | !bVar3 * auVar31[0x39];
          bVar3 = (bool)(bVar10 >> 2 & 1);
          auVar35[0x3a] = bVar3 * auVar30[0x3a] | !bVar3 * auVar31[0x3a];
          bVar3 = (bool)(bVar10 >> 3 & 1);
          auVar35[0x3b] = bVar3 * auVar30[0x3b] | !bVar3 * auVar31[0x3b];
          bVar3 = (bool)(bVar10 >> 4 & 1);
          auVar35[0x3c] = bVar3 * auVar30[0x3c] | !bVar3 * auVar31[0x3c];
          bVar3 = (bool)(bVar10 >> 5 & 1);
          auVar35[0x3d] = bVar3 * auVar30[0x3d] | !bVar3 * auVar31[0x3d];
          bVar3 = (bool)(bVar10 >> 6 & 1);
          auVar35[0x3e] = bVar3 * auVar30[0x3e] | !bVar3 * auVar31[0x3e];
          auVar35[0x3f] = -cVar12 * auVar30[0x3f] | !(bool)-cVar12 * auVar31[0x3f];
          auVar30 = vpmaddubsw_avx512bw(auVar24,auVar35);
          auVar31 = vmovdqa64_avx512f(pauVar15[6]);
          auVar32 = vpsubb_avx512bw(auVar47,auVar31);
          auVar31 = vmovdqu8_avx512bw(auVar31);
          auVar36[0] = (bVar2 & 1) * auVar31[0] | !(bool)(bVar2 & 1) * auVar32[0];
          bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
          auVar36[1] = bVar3 * auVar31[1] | !bVar3 * auVar32[1];
          bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
          auVar36[2] = bVar3 * auVar31[2] | !bVar3 * auVar32[2];
          bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
          auVar36[3] = bVar3 * auVar31[3] | !bVar3 * auVar32[3];
          bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
          auVar36[4] = bVar3 * auVar31[4] | !bVar3 * auVar32[4];
          bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
          auVar36[5] = bVar3 * auVar31[5] | !bVar3 * auVar32[5];
          bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
          auVar36[6] = bVar3 * auVar31[6] | !bVar3 * auVar32[6];
          bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
          auVar36[7] = bVar3 * auVar31[7] | !bVar3 * auVar32[7];
          auVar36[8] = (bVar4 & 1) * auVar31[8] | !(bool)(bVar4 & 1) * auVar32[8];
          bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
          auVar36[9] = bVar3 * auVar31[9] | !bVar3 * auVar32[9];
          bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
          auVar36[10] = bVar3 * auVar31[10] | !bVar3 * auVar32[10];
          bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
          auVar36[0xb] = bVar3 * auVar31[0xb] | !bVar3 * auVar32[0xb];
          bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
          auVar36[0xc] = bVar3 * auVar31[0xc] | !bVar3 * auVar32[0xc];
          bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
          auVar36[0xd] = bVar3 * auVar31[0xd] | !bVar3 * auVar32[0xd];
          bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
          auVar36[0xe] = bVar3 * auVar31[0xe] | !bVar3 * auVar32[0xe];
          bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
          auVar36[0xf] = bVar3 * auVar31[0xf] | !bVar3 * auVar32[0xf];
          auVar36[0x10] = (bVar5 & 1) * auVar31[0x10] | !(bool)(bVar5 & 1) * auVar32[0x10];
          bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
          auVar36[0x11] = bVar3 * auVar31[0x11] | !bVar3 * auVar32[0x11];
          bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
          auVar36[0x12] = bVar3 * auVar31[0x12] | !bVar3 * auVar32[0x12];
          bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
          auVar36[0x13] = bVar3 * auVar31[0x13] | !bVar3 * auVar32[0x13];
          bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
          auVar36[0x14] = bVar3 * auVar31[0x14] | !bVar3 * auVar32[0x14];
          bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
          auVar36[0x15] = bVar3 * auVar31[0x15] | !bVar3 * auVar32[0x15];
          bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
          auVar36[0x16] = bVar3 * auVar31[0x16] | !bVar3 * auVar32[0x16];
          bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
          auVar36[0x17] = bVar3 * auVar31[0x17] | !bVar3 * auVar32[0x17];
          auVar36[0x18] = (bVar6 & 1) * auVar31[0x18] | !(bool)(bVar6 & 1) * auVar32[0x18];
          bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
          auVar36[0x19] = bVar3 * auVar31[0x19] | !bVar3 * auVar32[0x19];
          bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
          auVar36[0x1a] = bVar3 * auVar31[0x1a] | !bVar3 * auVar32[0x1a];
          bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
          auVar36[0x1b] = bVar3 * auVar31[0x1b] | !bVar3 * auVar32[0x1b];
          bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
          auVar36[0x1c] = bVar3 * auVar31[0x1c] | !bVar3 * auVar32[0x1c];
          bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
          auVar36[0x1d] = bVar3 * auVar31[0x1d] | !bVar3 * auVar32[0x1d];
          bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
          auVar36[0x1e] = bVar3 * auVar31[0x1e] | !bVar3 * auVar32[0x1e];
          bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
          auVar36[0x1f] = bVar3 * auVar31[0x1f] | !bVar3 * auVar32[0x1f];
          auVar36[0x20] = (bVar7 & 1) * auVar31[0x20] | !(bool)(bVar7 & 1) * auVar32[0x20];
          bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
          auVar36[0x21] = bVar3 * auVar31[0x21] | !bVar3 * auVar32[0x21];
          bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
          auVar36[0x22] = bVar3 * auVar31[0x22] | !bVar3 * auVar32[0x22];
          bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
          auVar36[0x23] = bVar3 * auVar31[0x23] | !bVar3 * auVar32[0x23];
          bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
          auVar36[0x24] = bVar3 * auVar31[0x24] | !bVar3 * auVar32[0x24];
          bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
          auVar36[0x25] = bVar3 * auVar31[0x25] | !bVar3 * auVar32[0x25];
          bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
          auVar36[0x26] = bVar3 * auVar31[0x26] | !bVar3 * auVar32[0x26];
          bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
          auVar36[0x27] = bVar3 * auVar31[0x27] | !bVar3 * auVar32[0x27];
          auVar36[0x28] = (bVar8 & 1) * auVar31[0x28] | !(bool)(bVar8 & 1) * auVar32[0x28];
          bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
          auVar36[0x29] = bVar3 * auVar31[0x29] | !bVar3 * auVar32[0x29];
          bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
          auVar36[0x2a] = bVar3 * auVar31[0x2a] | !bVar3 * auVar32[0x2a];
          bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
          auVar36[0x2b] = bVar3 * auVar31[0x2b] | !bVar3 * auVar32[0x2b];
          bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
          auVar36[0x2c] = bVar3 * auVar31[0x2c] | !bVar3 * auVar32[0x2c];
          bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
          auVar36[0x2d] = bVar3 * auVar31[0x2d] | !bVar3 * auVar32[0x2d];
          bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
          auVar36[0x2e] = bVar3 * auVar31[0x2e] | !bVar3 * auVar32[0x2e];
          bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
          auVar36[0x2f] = bVar3 * auVar31[0x2f] | !bVar3 * auVar32[0x2f];
          auVar36[0x30] = (bVar9 & 1) * auVar31[0x30] | !(bool)(bVar9 & 1) * auVar32[0x30];
          bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
          auVar36[0x31] = bVar3 * auVar31[0x31] | !bVar3 * auVar32[0x31];
          bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
          auVar36[0x32] = bVar3 * auVar31[0x32] | !bVar3 * auVar32[0x32];
          bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
          auVar36[0x33] = bVar3 * auVar31[0x33] | !bVar3 * auVar32[0x33];
          bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
          auVar36[0x34] = bVar3 * auVar31[0x34] | !bVar3 * auVar32[0x34];
          bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
          auVar36[0x35] = bVar3 * auVar31[0x35] | !bVar3 * auVar32[0x35];
          bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
          auVar36[0x36] = bVar3 * auVar31[0x36] | !bVar3 * auVar32[0x36];
          bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
          auVar36[0x37] = bVar3 * auVar31[0x37] | !bVar3 * auVar32[0x37];
          auVar36[0x38] = (bVar10 & 1) * auVar31[0x38] | !(bool)(bVar10 & 1) * auVar32[0x38];
          bVar3 = (bool)(bVar10 >> 1 & 1);
          auVar36[0x39] = bVar3 * auVar31[0x39] | !bVar3 * auVar32[0x39];
          bVar3 = (bool)(bVar10 >> 2 & 1);
          auVar36[0x3a] = bVar3 * auVar31[0x3a] | !bVar3 * auVar32[0x3a];
          bVar3 = (bool)(bVar10 >> 3 & 1);
          auVar36[0x3b] = bVar3 * auVar31[0x3b] | !bVar3 * auVar32[0x3b];
          bVar3 = (bool)(bVar10 >> 4 & 1);
          auVar36[0x3c] = bVar3 * auVar31[0x3c] | !bVar3 * auVar32[0x3c];
          bVar3 = (bool)(bVar10 >> 5 & 1);
          auVar36[0x3d] = bVar3 * auVar31[0x3d] | !bVar3 * auVar32[0x3d];
          bVar3 = (bool)(bVar10 >> 6 & 1);
          auVar36[0x3e] = bVar3 * auVar31[0x3e] | !bVar3 * auVar32[0x3e];
          auVar36[0x3f] = -cVar12 * auVar31[0x3f] | !(bool)-cVar12 * auVar32[0x3f];
          auVar31 = vpmaddubsw_avx512bw(auVar24,auVar36);
          auVar32 = vmovdqa64_avx512f(pauVar15[7]);
          auVar33 = vpsubb_avx512bw(auVar47,auVar32);
          auVar32 = vmovdqu8_avx512bw(auVar32);
          auVar37[0] = (bVar2 & 1) * auVar32[0] | !(bool)(bVar2 & 1) * auVar33[0];
          bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
          auVar37[1] = bVar3 * auVar32[1] | !bVar3 * auVar33[1];
          bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
          auVar37[2] = bVar3 * auVar32[2] | !bVar3 * auVar33[2];
          bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
          auVar37[3] = bVar3 * auVar32[3] | !bVar3 * auVar33[3];
          bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
          auVar37[4] = bVar3 * auVar32[4] | !bVar3 * auVar33[4];
          bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
          auVar37[5] = bVar3 * auVar32[5] | !bVar3 * auVar33[5];
          bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
          auVar37[6] = bVar3 * auVar32[6] | !bVar3 * auVar33[6];
          bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
          auVar37[7] = bVar3 * auVar32[7] | !bVar3 * auVar33[7];
          auVar37[8] = (bVar4 & 1) * auVar32[8] | !(bool)(bVar4 & 1) * auVar33[8];
          bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
          auVar37[9] = bVar3 * auVar32[9] | !bVar3 * auVar33[9];
          bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
          auVar37[10] = bVar3 * auVar32[10] | !bVar3 * auVar33[10];
          bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
          auVar37[0xb] = bVar3 * auVar32[0xb] | !bVar3 * auVar33[0xb];
          bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
          auVar37[0xc] = bVar3 * auVar32[0xc] | !bVar3 * auVar33[0xc];
          bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
          auVar37[0xd] = bVar3 * auVar32[0xd] | !bVar3 * auVar33[0xd];
          bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
          auVar37[0xe] = bVar3 * auVar32[0xe] | !bVar3 * auVar33[0xe];
          bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
          auVar37[0xf] = bVar3 * auVar32[0xf] | !bVar3 * auVar33[0xf];
          auVar37[0x10] = (bVar5 & 1) * auVar32[0x10] | !(bool)(bVar5 & 1) * auVar33[0x10];
          bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
          auVar37[0x11] = bVar3 * auVar32[0x11] | !bVar3 * auVar33[0x11];
          bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
          auVar37[0x12] = bVar3 * auVar32[0x12] | !bVar3 * auVar33[0x12];
          bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
          auVar37[0x13] = bVar3 * auVar32[0x13] | !bVar3 * auVar33[0x13];
          bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
          auVar37[0x14] = bVar3 * auVar32[0x14] | !bVar3 * auVar33[0x14];
          bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
          auVar37[0x15] = bVar3 * auVar32[0x15] | !bVar3 * auVar33[0x15];
          bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
          auVar37[0x16] = bVar3 * auVar32[0x16] | !bVar3 * auVar33[0x16];
          bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
          auVar37[0x17] = bVar3 * auVar32[0x17] | !bVar3 * auVar33[0x17];
          auVar37[0x18] = (bVar6 & 1) * auVar32[0x18] | !(bool)(bVar6 & 1) * auVar33[0x18];
          bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
          auVar37[0x19] = bVar3 * auVar32[0x19] | !bVar3 * auVar33[0x19];
          bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
          auVar37[0x1a] = bVar3 * auVar32[0x1a] | !bVar3 * auVar33[0x1a];
          bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
          auVar37[0x1b] = bVar3 * auVar32[0x1b] | !bVar3 * auVar33[0x1b];
          bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
          auVar37[0x1c] = bVar3 * auVar32[0x1c] | !bVar3 * auVar33[0x1c];
          bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
          auVar37[0x1d] = bVar3 * auVar32[0x1d] | !bVar3 * auVar33[0x1d];
          bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
          auVar37[0x1e] = bVar3 * auVar32[0x1e] | !bVar3 * auVar33[0x1e];
          bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
          auVar37[0x1f] = bVar3 * auVar32[0x1f] | !bVar3 * auVar33[0x1f];
          auVar37[0x20] = (bVar7 & 1) * auVar32[0x20] | !(bool)(bVar7 & 1) * auVar33[0x20];
          bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
          auVar37[0x21] = bVar3 * auVar32[0x21] | !bVar3 * auVar33[0x21];
          bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
          auVar37[0x22] = bVar3 * auVar32[0x22] | !bVar3 * auVar33[0x22];
          bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
          auVar37[0x23] = bVar3 * auVar32[0x23] | !bVar3 * auVar33[0x23];
          bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
          auVar37[0x24] = bVar3 * auVar32[0x24] | !bVar3 * auVar33[0x24];
          bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
          auVar37[0x25] = bVar3 * auVar32[0x25] | !bVar3 * auVar33[0x25];
          bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
          auVar37[0x26] = bVar3 * auVar32[0x26] | !bVar3 * auVar33[0x26];
          bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
          auVar37[0x27] = bVar3 * auVar32[0x27] | !bVar3 * auVar33[0x27];
          auVar37[0x28] = (bVar8 & 1) * auVar32[0x28] | !(bool)(bVar8 & 1) * auVar33[0x28];
          bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
          auVar37[0x29] = bVar3 * auVar32[0x29] | !bVar3 * auVar33[0x29];
          bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
          auVar37[0x2a] = bVar3 * auVar32[0x2a] | !bVar3 * auVar33[0x2a];
          bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
          auVar37[0x2b] = bVar3 * auVar32[0x2b] | !bVar3 * auVar33[0x2b];
          bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
          auVar37[0x2c] = bVar3 * auVar32[0x2c] | !bVar3 * auVar33[0x2c];
          bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
          auVar37[0x2d] = bVar3 * auVar32[0x2d] | !bVar3 * auVar33[0x2d];
          bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
          auVar37[0x2e] = bVar3 * auVar32[0x2e] | !bVar3 * auVar33[0x2e];
          bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
          auVar37[0x2f] = bVar3 * auVar32[0x2f] | !bVar3 * auVar33[0x2f];
          auVar37[0x30] = (bVar9 & 1) * auVar32[0x30] | !(bool)(bVar9 & 1) * auVar33[0x30];
          bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
          auVar37[0x31] = bVar3 * auVar32[0x31] | !bVar3 * auVar33[0x31];
          bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
          auVar37[0x32] = bVar3 * auVar32[0x32] | !bVar3 * auVar33[0x32];
          bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
          auVar37[0x33] = bVar3 * auVar32[0x33] | !bVar3 * auVar33[0x33];
          bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
          auVar37[0x34] = bVar3 * auVar32[0x34] | !bVar3 * auVar33[0x34];
          bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
          auVar37[0x35] = bVar3 * auVar32[0x35] | !bVar3 * auVar33[0x35];
          bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
          auVar37[0x36] = bVar3 * auVar32[0x36] | !bVar3 * auVar33[0x36];
          bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
          auVar37[0x37] = bVar3 * auVar32[0x37] | !bVar3 * auVar33[0x37];
          auVar37[0x38] = (bVar10 & 1) * auVar32[0x38] | !(bool)(bVar10 & 1) * auVar33[0x38];
          bVar3 = (bool)(bVar10 >> 1 & 1);
          auVar37[0x39] = bVar3 * auVar32[0x39] | !bVar3 * auVar33[0x39];
          bVar3 = (bool)(bVar10 >> 2 & 1);
          auVar37[0x3a] = bVar3 * auVar32[0x3a] | !bVar3 * auVar33[0x3a];
          bVar3 = (bool)(bVar10 >> 3 & 1);
          auVar37[0x3b] = bVar3 * auVar32[0x3b] | !bVar3 * auVar33[0x3b];
          bVar3 = (bool)(bVar10 >> 4 & 1);
          auVar37[0x3c] = bVar3 * auVar32[0x3c] | !bVar3 * auVar33[0x3c];
          bVar3 = (bool)(bVar10 >> 5 & 1);
          auVar37[0x3d] = bVar3 * auVar32[0x3d] | !bVar3 * auVar33[0x3d];
          bVar3 = (bool)(bVar10 >> 6 & 1);
          auVar37[0x3e] = bVar3 * auVar32[0x3e] | !bVar3 * auVar33[0x3e];
          auVar37[0x3f] = -cVar12 * auVar32[0x3f] | !(bool)-cVar12 * auVar33[0x3f];
          auVar24 = vpmaddubsw_avx512bw(auVar24,auVar37);
          if ((A_rows & 0xffffffc0) != 0x40) {
            lVar18 = 0;
            do {
              auVar32 = vmovdqa64_avx512f(*(undefined1 (*) [64])(A + lVar18 * 8 + lVar13 + 0x200));
              auVar33 = vmovdqa64_avx512f(*(undefined1 (*) [64])(A + lVar18 * 8 + lVar13 + 0x240));
              auVar34 = vmovdqa64_avx512f(*(undefined1 (*) [64])(A + lVar18 * 8 + lVar13 + 0x280));
              auVar35 = vmovdqa64_avx512f(*(undefined1 (*) [64])(A + lVar18 * 8 + lVar13 + 0x2c0));
              auVar36 = vmovdqa64_avx512f(*(undefined1 (*) [64])(A + lVar18 * 8 + lVar13 + 0x300));
              auVar37 = vmovdqa64_avx512f(*(undefined1 (*) [64])(A + lVar18 * 8 + lVar13 + 0x340));
              auVar38 = vmovdqa64_avx512f(*(undefined1 (*) [64])(A + lVar18 * 8 + lVar13 + 0x380));
              auVar39 = vmovdqa64_avx512f(*(undefined1 (*) [64])(A + lVar18 * 8 + lVar13 + 0x3c0));
              auVar40 = vmovdqa64_avx512f(*(undefined1 (*) [64])(this + lVar18 + uVar16 + 0x40));
              uVar11 = vpcmpgtb_avx512bw(auVar40,auVar20);
              auVar40 = vpabsb_avx512bw(auVar40);
              auVar41 = vpsubb_avx512bw(auVar47,auVar32);
              auVar32 = vmovdqu8_avx512bw(auVar32);
              bVar2 = (byte)uVar11;
              auVar42[0] = (bVar2 & 1) * auVar32[0] | !(bool)(bVar2 & 1) * auVar41[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar42[1] = bVar3 * auVar32[1] | !bVar3 * auVar41[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar42[2] = bVar3 * auVar32[2] | !bVar3 * auVar41[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar42[3] = bVar3 * auVar32[3] | !bVar3 * auVar41[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar42[4] = bVar3 * auVar32[4] | !bVar3 * auVar41[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar42[5] = bVar3 * auVar32[5] | !bVar3 * auVar41[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar42[6] = bVar3 * auVar32[6] | !bVar3 * auVar41[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar42[7] = bVar3 * auVar32[7] | !bVar3 * auVar41[7];
              bVar4 = (byte)(uVar11 >> 8);
              auVar42[8] = (bVar4 & 1) * auVar32[8] | !(bool)(bVar4 & 1) * auVar41[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar42[9] = bVar3 * auVar32[9] | !bVar3 * auVar41[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar42[10] = bVar3 * auVar32[10] | !bVar3 * auVar41[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar42[0xb] = bVar3 * auVar32[0xb] | !bVar3 * auVar41[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar42[0xc] = bVar3 * auVar32[0xc] | !bVar3 * auVar41[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar42[0xd] = bVar3 * auVar32[0xd] | !bVar3 * auVar41[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar42[0xe] = bVar3 * auVar32[0xe] | !bVar3 * auVar41[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar42[0xf] = bVar3 * auVar32[0xf] | !bVar3 * auVar41[0xf];
              bVar5 = (byte)(uVar11 >> 0x10);
              auVar42[0x10] = (bVar5 & 1) * auVar32[0x10] | !(bool)(bVar5 & 1) * auVar41[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar42[0x11] = bVar3 * auVar32[0x11] | !bVar3 * auVar41[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar42[0x12] = bVar3 * auVar32[0x12] | !bVar3 * auVar41[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar42[0x13] = bVar3 * auVar32[0x13] | !bVar3 * auVar41[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar42[0x14] = bVar3 * auVar32[0x14] | !bVar3 * auVar41[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar42[0x15] = bVar3 * auVar32[0x15] | !bVar3 * auVar41[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar42[0x16] = bVar3 * auVar32[0x16] | !bVar3 * auVar41[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar42[0x17] = bVar3 * auVar32[0x17] | !bVar3 * auVar41[0x17];
              bVar6 = (byte)(uVar11 >> 0x18);
              auVar42[0x18] = (bVar6 & 1) * auVar32[0x18] | !(bool)(bVar6 & 1) * auVar41[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar42[0x19] = bVar3 * auVar32[0x19] | !bVar3 * auVar41[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar42[0x1a] = bVar3 * auVar32[0x1a] | !bVar3 * auVar41[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar42[0x1b] = bVar3 * auVar32[0x1b] | !bVar3 * auVar41[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar42[0x1c] = bVar3 * auVar32[0x1c] | !bVar3 * auVar41[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar42[0x1d] = bVar3 * auVar32[0x1d] | !bVar3 * auVar41[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar42[0x1e] = bVar3 * auVar32[0x1e] | !bVar3 * auVar41[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar42[0x1f] = bVar3 * auVar32[0x1f] | !bVar3 * auVar41[0x1f];
              bVar7 = (byte)(uVar11 >> 0x20);
              auVar42[0x20] = (bVar7 & 1) * auVar32[0x20] | !(bool)(bVar7 & 1) * auVar41[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar42[0x21] = bVar3 * auVar32[0x21] | !bVar3 * auVar41[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar42[0x22] = bVar3 * auVar32[0x22] | !bVar3 * auVar41[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar42[0x23] = bVar3 * auVar32[0x23] | !bVar3 * auVar41[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar42[0x24] = bVar3 * auVar32[0x24] | !bVar3 * auVar41[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar42[0x25] = bVar3 * auVar32[0x25] | !bVar3 * auVar41[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar42[0x26] = bVar3 * auVar32[0x26] | !bVar3 * auVar41[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar42[0x27] = bVar3 * auVar32[0x27] | !bVar3 * auVar41[0x27];
              bVar8 = (byte)(uVar11 >> 0x28);
              auVar42[0x28] = (bVar8 & 1) * auVar32[0x28] | !(bool)(bVar8 & 1) * auVar41[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar42[0x29] = bVar3 * auVar32[0x29] | !bVar3 * auVar41[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar42[0x2a] = bVar3 * auVar32[0x2a] | !bVar3 * auVar41[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar42[0x2b] = bVar3 * auVar32[0x2b] | !bVar3 * auVar41[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar42[0x2c] = bVar3 * auVar32[0x2c] | !bVar3 * auVar41[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar42[0x2d] = bVar3 * auVar32[0x2d] | !bVar3 * auVar41[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar42[0x2e] = bVar3 * auVar32[0x2e] | !bVar3 * auVar41[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar42[0x2f] = bVar3 * auVar32[0x2f] | !bVar3 * auVar41[0x2f];
              bVar9 = (byte)(uVar11 >> 0x30);
              auVar42[0x30] = (bVar9 & 1) * auVar32[0x30] | !(bool)(bVar9 & 1) * auVar41[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar42[0x31] = bVar3 * auVar32[0x31] | !bVar3 * auVar41[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar42[0x32] = bVar3 * auVar32[0x32] | !bVar3 * auVar41[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar42[0x33] = bVar3 * auVar32[0x33] | !bVar3 * auVar41[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar42[0x34] = bVar3 * auVar32[0x34] | !bVar3 * auVar41[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar42[0x35] = bVar3 * auVar32[0x35] | !bVar3 * auVar41[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar42[0x36] = bVar3 * auVar32[0x36] | !bVar3 * auVar41[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar42[0x37] = bVar3 * auVar32[0x37] | !bVar3 * auVar41[0x37];
              bVar10 = (byte)(uVar11 >> 0x38);
              auVar42[0x38] = (bVar10 & 1) * auVar32[0x38] | !(bool)(bVar10 & 1) * auVar41[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar42[0x39] = bVar3 * auVar32[0x39] | !bVar3 * auVar41[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar42[0x3a] = bVar3 * auVar32[0x3a] | !bVar3 * auVar41[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar42[0x3b] = bVar3 * auVar32[0x3b] | !bVar3 * auVar41[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar42[0x3c] = bVar3 * auVar32[0x3c] | !bVar3 * auVar41[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar42[0x3d] = bVar3 * auVar32[0x3d] | !bVar3 * auVar41[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar42[0x3e] = bVar3 * auVar32[0x3e] | !bVar3 * auVar41[0x3e];
              cVar12 = (char)bVar10 >> 7;
              auVar42[0x3f] = -cVar12 * auVar32[0x3f] | !(bool)-cVar12 * auVar41[0x3f];
              auVar32 = vpsubb_avx512bw(auVar47,auVar33);
              auVar33 = vmovdqu8_avx512bw(auVar33);
              auVar41[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar32[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar41[1] = bVar3 * auVar33[1] | !bVar3 * auVar32[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar41[2] = bVar3 * auVar33[2] | !bVar3 * auVar32[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar41[3] = bVar3 * auVar33[3] | !bVar3 * auVar32[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar41[4] = bVar3 * auVar33[4] | !bVar3 * auVar32[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar41[5] = bVar3 * auVar33[5] | !bVar3 * auVar32[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar41[6] = bVar3 * auVar33[6] | !bVar3 * auVar32[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar41[7] = bVar3 * auVar33[7] | !bVar3 * auVar32[7];
              auVar41[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar32[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar41[9] = bVar3 * auVar33[9] | !bVar3 * auVar32[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar41[10] = bVar3 * auVar33[10] | !bVar3 * auVar32[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar41[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar32[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar41[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar32[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar41[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar32[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar41[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar32[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar41[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar32[0xf];
              auVar41[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar32[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar41[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar32[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar41[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar32[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar41[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar32[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar41[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar32[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar41[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar32[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar41[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar32[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar41[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar32[0x17];
              auVar41[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar32[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar41[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar32[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar41[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar32[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar41[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar32[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar41[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar32[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar41[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar32[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar41[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar32[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar41[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar32[0x1f];
              auVar41[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar32[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar41[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar32[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar41[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar32[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar41[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar32[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar41[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar32[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar41[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar32[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar41[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar32[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar41[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar32[0x27];
              auVar41[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar32[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar41[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar32[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar41[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar32[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar41[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar32[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar41[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar32[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar41[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar32[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar41[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar32[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar41[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar32[0x2f];
              auVar41[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar32[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar41[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar32[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar41[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar32[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar41[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar32[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar41[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar32[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar41[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar32[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar41[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar32[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar41[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar32[0x37];
              auVar41[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar32[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar41[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar32[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar41[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar32[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar41[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar32[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar41[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar32[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar41[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar32[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar41[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar32[0x3e];
              auVar41[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar32[0x3f];
              auVar32 = vpsubb_avx512bw(auVar47,auVar34);
              auVar33 = vmovdqu8_avx512bw(auVar34);
              auVar43[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar32[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar43[1] = bVar3 * auVar33[1] | !bVar3 * auVar32[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar43[2] = bVar3 * auVar33[2] | !bVar3 * auVar32[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar43[3] = bVar3 * auVar33[3] | !bVar3 * auVar32[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar43[4] = bVar3 * auVar33[4] | !bVar3 * auVar32[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar43[5] = bVar3 * auVar33[5] | !bVar3 * auVar32[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar43[6] = bVar3 * auVar33[6] | !bVar3 * auVar32[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar43[7] = bVar3 * auVar33[7] | !bVar3 * auVar32[7];
              auVar43[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar32[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar43[9] = bVar3 * auVar33[9] | !bVar3 * auVar32[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar43[10] = bVar3 * auVar33[10] | !bVar3 * auVar32[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar43[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar32[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar43[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar32[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar43[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar32[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar43[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar32[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar43[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar32[0xf];
              auVar43[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar32[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar43[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar32[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar43[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar32[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar43[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar32[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar43[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar32[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar43[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar32[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar43[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar32[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar43[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar32[0x17];
              auVar43[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar32[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar43[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar32[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar43[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar32[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar43[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar32[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar43[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar32[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar43[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar32[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar43[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar32[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar43[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar32[0x1f];
              auVar43[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar32[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar43[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar32[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar43[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar32[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar43[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar32[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar43[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar32[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar43[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar32[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar43[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar32[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar43[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar32[0x27];
              auVar43[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar32[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar43[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar32[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar43[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar32[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar43[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar32[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar43[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar32[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar43[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar32[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar43[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar32[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar43[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar32[0x2f];
              auVar43[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar32[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar43[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar32[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar43[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar32[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar43[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar32[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar43[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar32[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar43[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar32[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar43[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar32[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar43[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar32[0x37];
              auVar43[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar32[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar43[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar32[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar43[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar32[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar43[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar32[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar43[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar32[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar43[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar32[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar43[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar32[0x3e];
              auVar43[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar32[0x3f];
              auVar32 = vpsubb_avx512bw(auVar47,auVar35);
              auVar33 = vmovdqu8_avx512bw(auVar35);
              auVar44[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar32[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar44[1] = bVar3 * auVar33[1] | !bVar3 * auVar32[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar44[2] = bVar3 * auVar33[2] | !bVar3 * auVar32[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar44[3] = bVar3 * auVar33[3] | !bVar3 * auVar32[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar44[4] = bVar3 * auVar33[4] | !bVar3 * auVar32[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar44[5] = bVar3 * auVar33[5] | !bVar3 * auVar32[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar44[6] = bVar3 * auVar33[6] | !bVar3 * auVar32[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar44[7] = bVar3 * auVar33[7] | !bVar3 * auVar32[7];
              auVar44[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar32[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar44[9] = bVar3 * auVar33[9] | !bVar3 * auVar32[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar44[10] = bVar3 * auVar33[10] | !bVar3 * auVar32[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar44[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar32[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar44[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar32[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar44[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar32[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar44[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar32[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar44[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar32[0xf];
              auVar44[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar32[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar44[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar32[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar44[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar32[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar44[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar32[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar44[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar32[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar44[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar32[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar44[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar32[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar44[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar32[0x17];
              auVar44[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar32[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar44[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar32[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar44[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar32[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar44[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar32[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar44[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar32[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar44[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar32[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar44[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar32[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar44[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar32[0x1f];
              auVar44[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar32[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar44[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar32[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar44[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar32[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar44[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar32[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar44[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar32[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar44[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar32[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar44[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar32[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar44[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar32[0x27];
              auVar44[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar32[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar44[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar32[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar44[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar32[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar44[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar32[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar44[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar32[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar44[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar32[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar44[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar32[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar44[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar32[0x2f];
              auVar44[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar32[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar44[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar32[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar44[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar32[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar44[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar32[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar44[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar32[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar44[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar32[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar44[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar32[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar44[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar32[0x37];
              auVar44[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar32[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar44[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar32[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar44[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar32[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar44[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar32[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar44[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar32[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar44[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar32[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar44[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar32[0x3e];
              auVar44[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar32[0x3f];
              auVar32 = vpsubb_avx512bw(auVar47,auVar36);
              auVar33 = vmovdqu8_avx512bw(auVar36);
              auVar45[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar32[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar45[1] = bVar3 * auVar33[1] | !bVar3 * auVar32[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar45[2] = bVar3 * auVar33[2] | !bVar3 * auVar32[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar45[3] = bVar3 * auVar33[3] | !bVar3 * auVar32[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar45[4] = bVar3 * auVar33[4] | !bVar3 * auVar32[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar45[5] = bVar3 * auVar33[5] | !bVar3 * auVar32[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar45[6] = bVar3 * auVar33[6] | !bVar3 * auVar32[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar45[7] = bVar3 * auVar33[7] | !bVar3 * auVar32[7];
              auVar45[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar32[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar45[9] = bVar3 * auVar33[9] | !bVar3 * auVar32[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar45[10] = bVar3 * auVar33[10] | !bVar3 * auVar32[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar45[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar32[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar45[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar32[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar45[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar32[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar45[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar32[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar45[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar32[0xf];
              auVar45[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar32[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar45[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar32[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar45[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar32[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar45[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar32[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar45[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar32[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar45[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar32[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar45[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar32[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar45[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar32[0x17];
              auVar45[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar32[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar45[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar32[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar45[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar32[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar45[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar32[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar45[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar32[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar45[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar32[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar45[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar32[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar45[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar32[0x1f];
              auVar45[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar32[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar45[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar32[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar45[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar32[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar45[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar32[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar45[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar32[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar45[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar32[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar45[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar32[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar45[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar32[0x27];
              auVar45[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar32[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar45[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar32[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar45[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar32[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar45[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar32[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar45[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar32[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar45[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar32[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar45[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar32[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar45[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar32[0x2f];
              auVar45[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar32[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar45[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar32[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar45[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar32[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar45[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar32[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar45[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar32[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar45[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar32[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar45[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar32[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar45[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar32[0x37];
              auVar45[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar32[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar45[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar32[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar45[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar32[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar45[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar32[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar45[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar32[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar45[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar32[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar45[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar32[0x3e];
              auVar45[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar32[0x3f];
              auVar32 = vpsubb_avx512bw(auVar47,auVar37);
              auVar33 = vmovdqu8_avx512bw(auVar37);
              auVar46[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar32[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar46[1] = bVar3 * auVar33[1] | !bVar3 * auVar32[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar46[2] = bVar3 * auVar33[2] | !bVar3 * auVar32[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar46[3] = bVar3 * auVar33[3] | !bVar3 * auVar32[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar46[4] = bVar3 * auVar33[4] | !bVar3 * auVar32[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar46[5] = bVar3 * auVar33[5] | !bVar3 * auVar32[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar46[6] = bVar3 * auVar33[6] | !bVar3 * auVar32[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar46[7] = bVar3 * auVar33[7] | !bVar3 * auVar32[7];
              auVar46[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar32[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar46[9] = bVar3 * auVar33[9] | !bVar3 * auVar32[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar46[10] = bVar3 * auVar33[10] | !bVar3 * auVar32[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar46[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar32[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar46[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar32[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar46[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar32[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar46[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar32[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar46[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar32[0xf];
              auVar46[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar32[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar46[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar32[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar46[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar32[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar46[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar32[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar46[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar32[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar46[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar32[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar46[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar32[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar46[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar32[0x17];
              auVar46[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar32[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar46[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar32[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar46[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar32[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar46[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar32[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar46[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar32[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar46[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar32[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar46[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar32[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar46[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar32[0x1f];
              auVar46[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar32[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar46[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar32[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar46[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar32[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar46[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar32[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar46[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar32[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar46[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar32[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar46[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar32[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar46[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar32[0x27];
              auVar46[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar32[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar46[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar32[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar46[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar32[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar46[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar32[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar46[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar32[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar46[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar32[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar46[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar32[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar46[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar32[0x2f];
              auVar46[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar32[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar46[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar32[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar46[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar32[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar46[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar32[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar46[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar32[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar46[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar32[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar46[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar32[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar46[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar32[0x37];
              auVar46[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar32[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar46[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar32[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar46[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar32[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar46[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar32[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar46[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar32[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar46[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar32[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar46[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar32[0x3e];
              auVar46[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar32[0x3f];
              auVar32 = vpsubb_avx512bw(auVar47,auVar38);
              auVar33 = vmovdqu8_avx512bw(auVar38);
              auVar38[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar32[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar38[1] = bVar3 * auVar33[1] | !bVar3 * auVar32[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar38[2] = bVar3 * auVar33[2] | !bVar3 * auVar32[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar38[3] = bVar3 * auVar33[3] | !bVar3 * auVar32[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar38[4] = bVar3 * auVar33[4] | !bVar3 * auVar32[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar38[5] = bVar3 * auVar33[5] | !bVar3 * auVar32[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar38[6] = bVar3 * auVar33[6] | !bVar3 * auVar32[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar38[7] = bVar3 * auVar33[7] | !bVar3 * auVar32[7];
              auVar38[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar32[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar38[9] = bVar3 * auVar33[9] | !bVar3 * auVar32[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar38[10] = bVar3 * auVar33[10] | !bVar3 * auVar32[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar38[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar32[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar38[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar32[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar38[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar32[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar38[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar32[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar38[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar32[0xf];
              auVar38[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar32[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar38[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar32[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar38[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar32[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar38[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar32[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar38[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar32[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar38[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar32[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar38[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar32[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar38[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar32[0x17];
              auVar38[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar32[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar38[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar32[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar38[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar32[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar38[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar32[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar38[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar32[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar38[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar32[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar38[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar32[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar38[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar32[0x1f];
              auVar38[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar32[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar38[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar32[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar38[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar32[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar38[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar32[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar38[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar32[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar38[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar32[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar38[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar32[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar38[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar32[0x27];
              auVar38[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar32[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar38[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar32[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar38[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar32[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar38[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar32[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar38[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar32[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar38[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar32[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar38[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar32[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar38[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar32[0x2f];
              auVar38[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar32[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar38[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar32[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar38[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar32[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar38[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar32[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar38[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar32[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar38[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar32[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar38[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar32[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar38[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar32[0x37];
              auVar38[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar32[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar38[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar32[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar38[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar32[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar38[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar32[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar38[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar32[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar38[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar32[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar38[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar32[0x3e];
              auVar38[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar32[0x3f];
              auVar32 = vpsubb_avx512bw(auVar47,auVar39);
              auVar33 = vmovdqu8_avx512bw(auVar39);
              auVar39[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar32[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar39[1] = bVar3 * auVar33[1] | !bVar3 * auVar32[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar39[2] = bVar3 * auVar33[2] | !bVar3 * auVar32[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar39[3] = bVar3 * auVar33[3] | !bVar3 * auVar32[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar39[4] = bVar3 * auVar33[4] | !bVar3 * auVar32[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar39[5] = bVar3 * auVar33[5] | !bVar3 * auVar32[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar39[6] = bVar3 * auVar33[6] | !bVar3 * auVar32[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar39[7] = bVar3 * auVar33[7] | !bVar3 * auVar32[7];
              auVar39[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar32[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar39[9] = bVar3 * auVar33[9] | !bVar3 * auVar32[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar39[10] = bVar3 * auVar33[10] | !bVar3 * auVar32[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar39[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar32[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar39[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar32[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar39[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar32[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar39[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar32[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar39[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar32[0xf];
              auVar39[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar32[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar39[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar32[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar39[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar32[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar39[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar32[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar39[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar32[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar39[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar32[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar39[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar32[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar39[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar32[0x17];
              auVar39[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar32[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar39[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar32[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar39[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar32[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar39[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar32[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar39[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar32[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar39[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar32[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar39[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar32[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar39[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar32[0x1f];
              auVar39[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar32[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar39[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar32[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar39[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar32[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar39[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar32[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar39[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar32[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar39[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar32[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar39[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar32[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar39[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar32[0x27];
              auVar39[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar32[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar39[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar32[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar39[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar32[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar39[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar32[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar39[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar32[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar39[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar32[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar39[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar32[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar39[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar32[0x2f];
              auVar39[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar32[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar39[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar32[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar39[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar32[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar39[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar32[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar39[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar32[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar39[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar32[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar39[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar32[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar39[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar32[0x37];
              auVar39[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar32[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar39[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar32[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar39[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar32[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar39[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar32[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar39[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar32[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar39[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar32[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar39[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar32[0x3e];
              auVar39[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar32[0x3f];
              auVar32 = vpmaddubsw_avx512bw(auVar40,auVar42);
              auVar25 = vpaddsw_avx512bw(auVar25,auVar32);
              auVar32 = vpmaddubsw_avx512bw(auVar40,auVar41);
              auVar26 = vpaddsw_avx512bw(auVar26,auVar32);
              auVar32 = vpmaddubsw_avx512bw(auVar40,auVar43);
              auVar27 = vpaddsw_avx512bw(auVar27,auVar32);
              auVar32 = vpmaddubsw_avx512bw(auVar40,auVar44);
              auVar28 = vpaddsw_avx512bw(auVar28,auVar32);
              auVar32 = vpmaddubsw_avx512bw(auVar40,auVar45);
              auVar29 = vpaddsw_avx512bw(auVar29,auVar32);
              auVar32 = vpmaddubsw_avx512bw(auVar40,auVar46);
              auVar30 = vpaddsw_avx512bw(auVar30,auVar32);
              auVar32 = vpmaddubsw_avx512bw(auVar40,auVar38);
              auVar31 = vpaddsw_avx512bw(auVar31,auVar32);
              auVar32 = vpmaddubsw_avx512bw(auVar40,auVar39);
              auVar24 = vpaddsw_avx512bw(auVar24,auVar32);
              lVar18 = lVar18 + 0x40;
            } while ((ulong)(A_rows & 0xffffffc0) - 0x40 != lVar18);
          }
          auVar25 = vpmaddwd_avx512bw(auVar25,auVar21);
          auVar26 = vpmaddwd_avx512bw(auVar26,auVar21);
          auVar27 = vpmaddwd_avx512bw(auVar27,auVar21);
          auVar28 = vpmaddwd_avx512bw(auVar28,auVar21);
          auVar29 = vpmaddwd_avx512bw(auVar29,auVar21);
          auVar30 = vpmaddwd_avx512bw(auVar30,auVar21);
          auVar31 = vpmaddwd_avx512bw(auVar31,auVar21);
          auVar24 = vpmaddwd_avx512bw(auVar24,auVar21);
          auVar32 = vpunpckldq_avx512f(auVar25,auVar26);
          auVar25 = vpunpckhdq_avx512f(auVar25,auVar26);
          auVar25 = vpaddd_avx512f(auVar25,auVar32);
          auVar26 = vpunpckldq_avx512f(auVar27,auVar28);
          auVar27 = vpunpckhdq_avx512f(auVar27,auVar28);
          auVar26 = vpaddd_avx512f(auVar27,auVar26);
          auVar27 = vpunpcklqdq_avx512f(auVar25,auVar26);
          auVar25 = vpunpckhqdq_avx512f(auVar25,auVar26);
          auVar25 = vpaddd_avx512f(auVar25,auVar27);
          auVar26 = vpunpckldq_avx512f(auVar29,auVar30);
          auVar27 = vpunpckhdq_avx512f(auVar29,auVar30);
          auVar26 = vpaddd_avx512f(auVar27,auVar26);
          auVar27 = vpunpckldq_avx512f(auVar31,auVar24);
          auVar24 = vpunpckhdq_avx512f(auVar31,auVar24);
          auVar24 = vpaddd_avx512f(auVar24,auVar27);
          auVar27 = vpunpcklqdq_avx512f(auVar26,auVar24);
          auVar24 = vpunpckhqdq_avx512f(auVar26,auVar24);
          auVar24 = vpaddd_avx512f(auVar24,auVar27);
          auVar26 = vmovdqa64_avx512f(auVar25);
          auVar26 = vpermt2q_avx512f(auVar26,auVar22,auVar24);
          auVar24 = vpermt2q_avx512f(auVar25,auVar23,auVar24);
          auVar24 = vpaddd_avx512f(auVar26,auVar24);
          auVar19 = vextracti64x4_avx512f(auVar24,1);
          auVar19 = vpaddd_avx2(auVar24._0_32_,auVar19);
          auVar19 = vcvtdq2ps_avx(auVar19);
          pfVar1 = (float *)(CONCAT44(in_register_0000008c,B_cols) +
                            (ulong)((int)uVar14 * width + (int)uVar17) * 4);
          *pfVar1 = in_XMM0_Da * auVar19._0_4_;
          pfVar1[1] = in_XMM0_Da * auVar19._4_4_;
          pfVar1[2] = in_XMM0_Da * auVar19._8_4_;
          pfVar1[3] = in_XMM0_Da * auVar19._12_4_;
          pfVar1[4] = in_XMM0_Da * auVar19._16_4_;
          pfVar1[5] = in_XMM0_Da * auVar19._20_4_;
          pfVar1[6] = in_XMM0_Da * auVar19._24_4_;
          pfVar1[7] = auVar19._28_4_;
          uVar14 = uVar14 + 1;
          uVar16 = (ulong)((int)uVar16 + A_rows);
        } while (uVar14 != ((ulong)B & 0xffffffff));
      }
      uVar17 = uVar17 + 8;
      local_60 = (ulong)((int)local_60 + (A_rows >> 6) * 8);
    } while (uVar17 < width);
  }
  return;
}

Assistant:

INTGEMM_AVX512BW static void Multiply(const int8_t *A, const int8_t *B, Index A_rows, Index width, Index B_cols, Callback callback) {
    // This is copy-paste from Multiply8_SSE2OrAVX2.
    assert(width % sizeof(Register) == 0);
    assert(B_cols % 8 == 0);
    assert(reinterpret_cast<uintptr_t>(A) % sizeof(Register) == 0);
    assert(reinterpret_cast<uintptr_t>(B) % sizeof(Register) == 0);
    // There's 8 results for INTGEMM_AVX2 to handle.
    auto callback_impl = callbacks::CallbackImpl<CPUType::AVX2, Callback>(callback);
    const Index simd_width = width / sizeof(Register);
    // Added for AVX512.
    Register zeros = setzero_si<Register>();
    // Go over 8 columns of B at a time.
#pragma omp for
    for (Index B0_colidx = 0; B0_colidx < B_cols; B0_colidx += 8) {
      const Register *B0_col = reinterpret_cast<const Register*>(B) + B0_colidx * simd_width;
      // Process one row of A at a time.  Doesn't seem to be faster to do multiple rows of A at once.
      for (Index A_rowidx = 0; A_rowidx < A_rows; ++A_rowidx) {
        // Iterate over shared (inner) dimension.
        const Register *A_live = reinterpret_cast<const Register *>(A + A_rowidx * width);
        const Register *A_end = A_live + simd_width;
        const Register *B_live = B0_col;

        // Do the first iteration to initialize the sums.
        __m512i a = *A_live;
        __mmask64 neg_mask = _mm512_test_epi8_mask(a, _mm512_set1_epi8(-128));
        __m512i a_positive = _mm512_abs_epi8(a);
        // These will be packed 16-bit integers containing sums for each column of B multiplied by the row of A.
        Register sum0 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[0], neg_mask, zeros, B_live[0]));
        Register sum1 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[1], neg_mask, zeros, B_live[1]));
        Register sum2 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[2], neg_mask, zeros, B_live[2]));
        Register sum3 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[3], neg_mask, zeros, B_live[3]));
        Register sum4 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[4], neg_mask, zeros, B_live[4]));
        Register sum5 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[5], neg_mask, zeros, B_live[5]));
        Register sum6 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[6], neg_mask, zeros, B_live[6]));
        Register sum7 = maddubs_epi16(a_positive, _mm512_mask_sub_epi8(B_live[7], neg_mask, zeros, B_live[7]));

        ++A_live;
        B_live += 8;

        // Use A as the loop variable so the add can be done where gcc likes it
        // for branch prediction.
        for (; A_live != A_end; ++A_live, B_live += 8) {
          // Unique code here: can we do an inline function?
          // Retrieve a.  We will use this as the unsigned part.
          a = *A_live;
          // Retrieve the conveniently consecutive values of B.
          __m512i b0 = *B_live;
          __m512i b1 = *(B_live + 1);
          __m512i b2 = *(B_live + 2);
          __m512i b3 = *(B_live + 3);
          __m512i b4 = *(B_live + 4);
          __m512i b5 = *(B_live + 5);
          __m512i b6 = *(B_live + 6);
          __m512i b7 = *(B_live + 7);

          // Get a mask where a is negative.
          // Didn't seem to make a difference definining sign bits here vs at top
          neg_mask = _mm512_test_epi8_mask(a, _mm512_set1_epi8(-128));
          a_positive = _mm512_abs_epi8(a);

          // Negate by subtracting from zero with a mask.
          b0 = _mm512_mask_sub_epi8(b0, neg_mask, zeros, b0);
          b1 = _mm512_mask_sub_epi8(b1, neg_mask, zeros, b1);
          b2 = _mm512_mask_sub_epi8(b2, neg_mask, zeros, b2);
          b3 = _mm512_mask_sub_epi8(b3, neg_mask, zeros, b3);
          b4 = _mm512_mask_sub_epi8(b4, neg_mask, zeros, b4);
          b5 = _mm512_mask_sub_epi8(b5, neg_mask, zeros, b5);
          b6 = _mm512_mask_sub_epi8(b6, neg_mask, zeros, b6);
          b7 = _mm512_mask_sub_epi8(b7, neg_mask, zeros, b7);
          // The magic 8-bit multiply then horizontal sum into 16-bit.
          b0 = _mm512_maddubs_epi16(a_positive, b0);
          b1 = _mm512_maddubs_epi16(a_positive, b1);
          b2 = _mm512_maddubs_epi16(a_positive, b2);
          b3 = _mm512_maddubs_epi16(a_positive, b3);
          b4 = _mm512_maddubs_epi16(a_positive, b4);
          b5 = _mm512_maddubs_epi16(a_positive, b5);
          b6 = _mm512_maddubs_epi16(a_positive, b6);
          b7 = _mm512_maddubs_epi16(a_positive, b7);
          // Now we have 16-bit results that are the sum of two multiplies.
          // Choosing to approximate and do adds.
          // Perhaps every so often we could accumulate by upcasting.
          sum0 = _mm512_adds_epi16(sum0, b0);
          sum1 = _mm512_adds_epi16(sum1, b1);
          sum2 = _mm512_adds_epi16(sum2, b2);
          sum3 = _mm512_adds_epi16(sum3, b3);
          sum4 = _mm512_adds_epi16(sum4, b4);
          sum5 = _mm512_adds_epi16(sum5, b5);
          sum6 = _mm512_adds_epi16(sum6, b6);
          sum7 = _mm512_adds_epi16(sum7, b7);
          // Unique code ends: can we do an inline function?
        }
        // Upcast to 32-bit and horizontally add.
        Register ones = set1_epi16<Register>(1);
        sum0 = madd_epi16(sum0, ones);
        sum1 = madd_epi16(sum1, ones);
        sum2 = madd_epi16(sum2, ones);
        sum3 = madd_epi16(sum3, ones);
        sum4 = madd_epi16(sum4, ones);
        sum5 = madd_epi16(sum5, ones);
        sum6 = madd_epi16(sum6, ones);
        sum7 = madd_epi16(sum7, ones);
        Register pack0123 = Pack0123(sum0, sum1, sum2, sum3);
        Register pack4567 = Pack0123(sum4, sum5, sum6, sum7);

        auto total = PermuteSummer(pack0123, pack4567);
        callback_impl.Run(total, callbacks::OutputBufferInfo(A_rowidx, B0_colidx, A_rows, B_cols));
      }
    }
  }